

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMNontrappingFPToIntLowering.cpp
# Opt level: O3

void __thiscall
wasm::LLVMNonTrappingFPToIntLoweringImpl::replaceSigned<double,long>
          (LLVMNonTrappingFPToIntLoweringImpl *this,Unary *curr)

{
  Module *pMVar1;
  Type type_;
  uintptr_t uVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  Index IVar5;
  UnaryOp UVar6;
  LocalSet *this_00;
  Unary *pUVar7;
  Const *pCVar8;
  Binary *this_01;
  Expression *pEVar9;
  If *this_02;
  ulong uVar10;
  Type in_R8;
  MixedArena *this_03;
  optional<wasm::Type> type__00;
  Builder local_50;
  Builder builder;
  
  uVar4 = curr->op - TruncSatSFloat32ToInt32;
  if ((uVar4 < 7) && ((0x55U >> (uVar4 & 0x1f) & 1) != 0)) {
    UVar6 = *(UnaryOp *)(&DAT_00df2f80 + (ulong)uVar4 * 4);
    builder.wasm._4_4_ = *(BinaryOp *)(&DAT_00df2fb8 + (ulong)uVar4 * 4);
    pMVar1 = (this->
             super_WalkerPass<wasm::PostWalker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>_>
             ).
             super_PostWalker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>
             .
             super_Walker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>
             .currModule;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (curr->value->type).id;
    local_50.wasm = pMVar1;
    IVar5 = Builder::addVar((Builder *)
                            (this->
                            super_WalkerPass<wasm::PostWalker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>_>
                            ).
                            super_PostWalker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>
                            .
                            super_Walker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>
                            .currFunction,(Function *)0x0,(Name)(auVar3 << 0x40),in_R8);
    pEVar9 = curr->value;
    type_.id = (pEVar9->type).id;
    this_03 = &pMVar1->allocator;
    this_00 = (LocalSet *)MixedArena::allocSpace(this_03,0x20,8);
    (this_00->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id = LocalSetId;
    (this_00->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type.id = 0;
    this_00->index = IVar5;
    this_00->value = pEVar9;
    LocalSet::makeTee(this_00,type_);
    pUVar7 = (Unary *)MixedArena::allocSpace(this_03,0x20,8);
    (pUVar7->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id = UnaryId;
    (pUVar7->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = 0;
    pUVar7->op = UVar6;
    pUVar7->value = (Expression *)this_00;
    Unary::finalize(pUVar7);
    pCVar8 = Builder::makeConst<double>(&local_50,9.223372036854776e+18);
    this_01 = (Binary *)MixedArena::allocSpace(&(local_50.wasm)->allocator,0x28,8);
    (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    this_01->op = builder.wasm._4_4_;
    this_01->left = (Expression *)pUVar7;
    this_01->right = (Expression *)pCVar8;
    Binary::finalize(this_01);
    UVar6 = getReplacementOp(this,curr->op);
    uVar2 = (curr->value->type).id;
    pEVar9 = (Expression *)MixedArena::allocSpace(&(local_50.wasm)->allocator,0x18,8);
    pEVar9->_id = LocalGetId;
    *(Index *)(pEVar9 + 1) = IVar5;
    (pEVar9->type).id = uVar2;
    pUVar7 = (Unary *)MixedArena::allocSpace(&(local_50.wasm)->allocator,0x20,8);
    (pUVar7->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id = UnaryId;
    (pUVar7->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = 0;
    pUVar7->op = UVar6;
    pUVar7->value = pEVar9;
    Unary::finalize(pUVar7);
    pCVar8 = Builder::makeConst<long>(&local_50,-0x8000000000000000);
    uVar10 = 0x28;
    this_02 = (If *)MixedArena::allocSpace(&(local_50.wasm)->allocator,0x28,8);
    (this_02->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression._id = IfId;
    (this_02->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id = 0;
    this_02->condition = (Expression *)this_01;
    this_02->ifTrue = (Expression *)pUVar7;
    this_02->ifFalse = (Expression *)pCVar8;
    type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar10;
    If::finalize(this_02,type__00);
    Walker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>
    ::replaceCurrent(&(this->
                      super_WalkerPass<wasm::PostWalker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>_>
                      ).
                      super_PostWalker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>
                      .
                      super_Walker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>
                     ,(Expression *)this_02);
    return;
  }
  handle_unreachable("Unexpected opcode",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/LLVMNontrappingFPToIntLowering.cpp"
                     ,0x47);
}

Assistant:

void replaceSigned(Unary* curr) {
    BinaryOp ltOp;
    UnaryOp absOp;
    switch (curr->op) {
      case TruncSatSFloat32ToInt32:
      case TruncSatSFloat32ToInt64:
        ltOp = LtFloat32;
        absOp = AbsFloat32;
        break;
      case TruncSatSFloat64ToInt32:
      case TruncSatSFloat64ToInt64:
        ltOp = LtFloat64;
        absOp = AbsFloat64;
        break;
      default:
        WASM_UNREACHABLE("Unexpected opcode");
    }

    Builder builder(*getModule());
    Index v = Builder::addVar(getFunction(), curr->value->type);
    // if fabs(operand) < INT_MAX then use the trapping operation, else return
    // INT_MIN. The altnernate value is correct for the case where the input is
    // INT_MIN itself; otherwise it's UB so any value will do.
    replaceCurrent(builder.makeIf(
      builder.makeBinary(
        ltOp,
        builder.makeUnary(
          absOp, builder.makeLocalTee(v, curr->value, curr->value->type)),
        builder.makeConst(static_cast<From>(std::numeric_limits<To>::max()))),
      builder.makeUnary(getReplacementOp(curr->op),
                        builder.makeLocalGet(v, curr->value->type)),
      builder.makeConst(std::numeric_limits<To>::min())));
  }